

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O2

Tim_Man_t * Tim_ManStart(int nCis,int nCos)

{
  Tim_Man_t *pTVar1;
  Mem_Flex_t *pMVar2;
  Tim_Obj_t *pTVar3;
  Tim_Obj_t *pTVar4;
  float *pfVar5;
  ulong uVar6;
  ulong uVar7;
  
  pTVar1 = (Tim_Man_t *)calloc(1,0x38);
  uVar7 = 0;
  pMVar2 = Mem_FlexStart();
  pTVar1->pMemObj = pMVar2;
  pTVar1->nCis = nCis;
  pTVar1->nCos = nCos;
  pTVar3 = (Tim_Obj_t *)calloc(1,(long)nCis * 0x18);
  pTVar1->pCis = pTVar3;
  pTVar4 = (Tim_Obj_t *)calloc(1,(long)nCos * 0x18);
  pTVar1->pCos = pTVar4;
  if (pTVar3 != (Tim_Obj_t *)0x0) {
    uVar6 = (ulong)(uint)nCis;
    if (nCis < 1) {
      uVar6 = uVar7;
    }
    pfVar5 = &pTVar3->timeReq;
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      ((Tim_Obj_t *)(pfVar5 + -5))->Id = (int)uVar7;
      *(undefined8 *)(pfVar5 + -3) = 0xffffffffffffffff;
      *pfVar5 = 1e+09;
      pfVar5 = pfVar5 + 6;
    }
  }
  if (pTVar4 != (Tim_Obj_t *)0x0) {
    uVar6 = 0;
    uVar7 = (ulong)(uint)nCos;
    if (nCos < 1) {
      uVar7 = uVar6;
    }
    pfVar5 = &pTVar4->timeReq;
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      ((Tim_Obj_t *)(pfVar5 + -5))->Id = (int)uVar6;
      *(undefined8 *)(pfVar5 + -3) = 0xffffffffffffffff;
      *pfVar5 = 1e+09;
      pfVar5 = pfVar5 + 6;
    }
  }
  pTVar1->fUseTravId = 1;
  return pTVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the timing manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Tim_Man_t * Tim_ManStart( int nCis, int nCos )
{
    Tim_Man_t * p;
    Tim_Obj_t * pObj;
    int i;
    p = ABC_ALLOC( Tim_Man_t, 1 );
    memset( p, 0, sizeof(Tim_Man_t) );
    p->pMemObj = Mem_FlexStart();
    p->nCis = nCis;
    p->nCos = nCos;
    p->pCis = ABC_ALLOC( Tim_Obj_t, nCis );
    memset( p->pCis, 0, sizeof(Tim_Obj_t) * nCis );
    p->pCos = ABC_ALLOC( Tim_Obj_t, nCos );
    memset( p->pCos, 0, sizeof(Tim_Obj_t) * nCos );
    Tim_ManForEachCi( p, pObj, i )
    {
        pObj->Id = i;
        pObj->iObj2Box = pObj->iObj2Num = -1;
        pObj->timeReq = TIM_ETERNITY;
    }
    Tim_ManForEachCo( p, pObj, i )
    {
        pObj->Id = i;
        pObj->iObj2Box = pObj->iObj2Num = -1;
        pObj->timeReq = TIM_ETERNITY;
    }
    p->fUseTravId = 1;
    return p;
}